

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O1

unique_ptr<Entry<ON_SimpleArray<int>_>,_std::default_delete<Entry<ON_SimpleArray<int>_>_>_>
make_entry<ON_SimpleArray<int>>(ON_SimpleArray<int> *value)

{
  _func_int **pp_Var1;
  ON_SimpleArray<int> *in_RSI;
  
  pp_Var1 = (_func_int **)operator_new(0x20);
  *pp_Var1 = (_func_int *)&PTR__DictionaryEntryT_00818d30;
  pp_Var1[1] = (_func_int *)&PTR__ON_SimpleArray_008176a8;
  pp_Var1[2] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x0;
  ON_SimpleArray<int>::operator=((ON_SimpleArray<int> *)(pp_Var1 + 1),in_RSI);
  *pp_Var1 = (_func_int *)&PTR__DictionaryEntryT_00818cc0;
  value->_vptr_ON_SimpleArray = pp_Var1;
  return (__uniq_ptr_data<Entry<ON_SimpleArray<int>_>,_std::default_delete<Entry<ON_SimpleArray<int>_>_>,_true,_true>
          )(__uniq_ptr_data<Entry<ON_SimpleArray<int>_>,_std::default_delete<Entry<ON_SimpleArray<int>_>_>,_true,_true>
            )value;
}

Assistant:

static std::unique_ptr<Entry<T>> make_entry(const T& value)
{
  return std::make_unique<Entry<T>>(value);
}